

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_>::
write_decimal<long_long>(basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_> *this,longlong value)

{
  undefined2 uVar1;
  buffer<wchar_t> *pbVar2;
  size_t sVar3;
  bool bVar4;
  long lVar5;
  undefined1 *puVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  wchar_t *__dest;
  undefined1 uVar12;
  undefined1 auVar11 [16];
  wchar_t buffer [40];
  undefined1 auStack_d8 [168];
  
  uVar7 = -value;
  if (0 < value) {
    uVar7 = value;
  }
  lVar5 = 0x3f;
  if ((uVar7 | 1) != 0) {
    for (; (uVar7 | 1) >> lVar5 == 0; lVar5 = lVar5 + -1) {
    }
  }
  uVar8 = ((uint)lVar5 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  uVar9 = (ulong)((uVar8 - (uVar7 < *(ulong *)(basic_data<void>::zero_or_powers_of_10_64 +
                                              (ulong)uVar8 * 8))) + 1);
  pbVar2 = (this->out_).container;
  sVar3 = pbVar2->size_;
  uVar10 = (sVar3 - (value >> 0x3f)) + uVar9;
  if (pbVar2->capacity_ < uVar10) {
    (**pbVar2->_vptr_buffer)(pbVar2,uVar10);
  }
  __dest = pbVar2->ptr_ + sVar3;
  pbVar2->size_ = uVar10;
  if (value < 0) {
    *__dest = L'-';
    __dest = __dest + 1;
  }
  puVar6 = auStack_d8 + uVar9 * 4;
  uVar10 = uVar7;
  if (99 < uVar7) {
    do {
      uVar7 = uVar10 / 100;
      uVar1 = *(undefined2 *)
               (basic_data<void>::digits + (ulong)(uint)((int)uVar10 + (int)uVar7 * -100) * 2);
      uVar12 = (undefined1)((ushort)uVar1 >> 8);
      auVar11 = ZEXT416(CONCAT22((short)(CONCAT13(uVar12,CONCAT12(uVar12,uVar1)) >> 0x10),
                                 CONCAT11((char)uVar1,(char)uVar1)));
      auVar11 = pshuflw(auVar11,auVar11,0x60);
      *(ulong *)(puVar6 + -8) = CONCAT44(auVar11._4_4_ >> 0x18,auVar11._0_4_ >> 0x18);
      puVar6 = puVar6 + -8;
      bVar4 = 9999 < uVar10;
      uVar10 = uVar7;
    } while (bVar4);
  }
  if (uVar7 < 10) {
    uVar8 = (uint)uVar7 | 0x30;
    lVar5 = -4;
  }
  else {
    *(int *)(puVar6 + -4) =
         (int)(char)basic_data<void>::digits[((uVar7 & 0xffffffff) * 2 & 0xffffffff) + 1];
    uVar8 = (uint)(char)basic_data<void>::digits[(uVar7 & 0xffffffff) * 2];
    lVar5 = -8;
  }
  *(uint *)(puVar6 + lVar5) = uVar8;
  if (uVar9 != 0) {
    switchD_015ff80e::default(__dest,auStack_d8,uVar9 << 2);
  }
  return;
}

Assistant:

void write_decimal(Int value) {
    auto abs_value = static_cast<uint32_or_64_or_128_t<Int>>(value);
    bool negative = is_negative(value);
    // Don't do -abs_value since it trips unsigned-integer-overflow sanitizer.
    if (negative) abs_value = ~abs_value + 1;
    int num_digits = count_digits(abs_value);
    auto&& it = reserve((negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (negative) *it++ = static_cast<char_type>('-');
    it = format_decimal<char_type>(it, abs_value, num_digits);
  }